

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xoshiro256plus.hpp
# Opt level: O0

basic_istream<char,_std::char_traits<char>_> *
trng::operator>>(basic_istream<char,_std::char_traits<char>_> *in,xoshiro256plus *R)

{
  bool bVar1;
  fmtflags __fmtfl;
  _Ios_Fmtflags _Var2;
  basic_istream<char,_std::char_traits<char>_> *this;
  basic_istream<char,_std::char_traits<char>_> *in_RSI;
  basic_istream<char,_std::char_traits<char>_> *in_RDI;
  fmtflags flags;
  status_type S_new;
  basic_istream<char,_std::char_traits<char>_> *in_00;
  delim_str *in_stack_ffffffffffffffa8;
  basic_istream<char,_std::char_traits<char>_> *in_stack_ffffffffffffffb0;
  result_type local_30;
  result_type local_28;
  result_type local_20;
  status_type *in_stack_ffffffffffffffe8;
  
  xoshiro256plus::status_type::status_type((status_type *)&local_30);
  __fmtfl = Catch::clara::std::ios_base::flags
                      ((ios_base *)(in_RDI + *(long *)(*(long *)in_RDI + -0x18)));
  this = in_RDI + *(long *)(*(long *)in_RDI + -0x18);
  _Var2 = Catch::clara::std::operator|(_S_dec,_S_fixed);
  _Var2 = Catch::clara::std::operator|(_Var2,_S_left);
  Catch::clara::std::ios_base::flags((ios_base *)this,_Var2);
  in_00 = in_RDI;
  utility::ignore_spaces();
  utility::operator>>(in_00,(ignore_spaces_cl *)this);
  utility::delim('\0');
  utility::operator>>(in_00,(delim_c *)this);
  xoshiro256plus::name();
  utility::delim((char *)this);
  utility::operator>>(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  utility::delim('\0');
  utility::operator>>(in_00,(delim_c *)this);
  operator>>(in_RSI,in_stack_ffffffffffffffe8);
  utility::delim('\0');
  utility::operator>>(in_00,(delim_c *)this);
  bVar1 = std::ios::operator_cast_to_bool((ios *)(in_RDI + *(long *)(*(long *)in_RDI + -0x18)));
  if (bVar1) {
    *(result_type *)in_RSI = local_30;
    *(result_type *)(in_RSI + 8) = local_28;
    *(result_type *)(in_RSI + 0x10) = local_20;
    *(status_type **)(in_RSI + 0x18) = in_stack_ffffffffffffffe8;
  }
  Catch::clara::std::ios_base::flags
            ((ios_base *)(in_RDI + *(long *)(*(long *)in_RDI + -0x18)),__fmtfl);
  return in_RDI;
}

Assistant:

std::basic_istream<char_t, traits_t> &operator>>(
        std::basic_istream<char_t, traits_t> &in, xoshiro256plus &R) {
      xoshiro256plus::status_type S_new;
      std::ios_base::fmtflags flags(in.flags());
      in.flags(std::ios_base::dec | std::ios_base::fixed | std::ios_base::left);
      in >> utility::ignore_spaces();
      in >> utility::delim('[') >> utility::delim(xoshiro256plus::name()) >>
          utility::delim(' ') >> S_new >> utility::delim(']');
      if (in) {
        R.S = S_new;
      }
      in.flags(flags);
      return in;
    }